

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O1

int i2d_SSL_SESSION_bio(BIO *bio,SSL_SESSION *session)

{
  int iVar1;
  UniquePtr<uint8_t> free_data;
  size_t len;
  uint8_t *data;
  _Head_base<0UL,_unsigned_char_*,_false> local_20;
  size_t local_18;
  _Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter> local_10;
  
  iVar1 = SSL_SESSION_to_bytes(session,(uint8_t **)&local_10,&local_18);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    local_20 = local_10.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    iVar1 = BIO_write_all(bio,(void *)local_10.super__Head_base<0UL,_unsigned_char_*,_false>.
                                      _M_head_impl,local_18);
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_20);
  }
  return iVar1;
}

Assistant:

int i2d_SSL_SESSION_bio(BIO *bio, const SSL_SESSION *session) {
  uint8_t *data;
  size_t len;
  if (!SSL_SESSION_to_bytes(session, &data, &len)) {
    return 0;
  }
  bssl::UniquePtr<uint8_t> free_data(data);
  return BIO_write_all(bio, data, len);
}